

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::clearRenderbuffer
               (Functions *gl,TextureFormat *format,int renderbufferNdx,int renderbufferCount,
               TextureLevel *refRenderbuffer)

{
  glClearBufferfvFunc p_Var1;
  glClearBufferivFunc p_Var2;
  glClearBufferuivFunc p_Var3;
  TextureChannelClass TVar4;
  GLenum err;
  float *pfVar5;
  int *piVar6;
  uint *puVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  PixelBufferAccess local_1e0;
  undefined1 local_1b8 [8];
  Vec4 color_4;
  float alpha_4;
  float blue_4;
  float green_4;
  float red_4;
  undefined1 local_170 [8];
  Vec4 color_3;
  float alpha_3;
  float blue_3;
  float green_3;
  float red_3;
  undefined1 local_128 [8];
  UVec4 color_2;
  deUint32 alpha_2;
  deUint32 blue_2;
  deUint32 green_2;
  deUint32 red_2;
  undefined1 local_e0 [8];
  IVec4 color_1;
  deInt32 alpha_1;
  deInt32 blue_1;
  deInt32 green_1;
  deInt32 red_1;
  undefined1 local_98 [8];
  Vec4 color;
  float alpha;
  float blue;
  float green;
  float red;
  float alphaScale;
  float greenScale;
  float blueScale;
  float redScale;
  TextureFormatInfo info;
  TextureLevel *refRenderbuffer_local;
  int renderbufferCount_local;
  int renderbufferNdx_local;
  TextureFormat *format_local;
  Functions *gl_local;
  
  info.lookupBias.m_data._8_8_ = refRenderbuffer;
  tcu::getTextureFormatInfo((TextureFormatInfo *)&blueScale,format);
  fVar8 = (float)(renderbufferNdx + 1) / (float)renderbufferCount;
  fVar9 = (float)(renderbufferCount - renderbufferNdx) / (float)renderbufferCount;
  fVar10 = (float)((renderbufferCount / 2 + renderbufferNdx) % renderbufferCount) /
           (float)renderbufferCount;
  fVar11 = (float)(((renderbufferCount / 2 + renderbufferCount) - renderbufferNdx) %
                   renderbufferCount + 1) / (float)renderbufferCount;
  TVar4 = tcu::getTextureChannelClass(format->type);
  switch(TVar4) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    fVar18 = tcu::Vector<float,_4>::x((Vector<float,_4> *)&blueScale);
    fVar19 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(info.valueMin.m_data + 2));
    fVar20 = tcu::Vector<float,_4>::x((Vector<float,_4> *)&blueScale);
    fVar12 = tcu::Vector<float,_4>::y((Vector<float,_4> *)&blueScale);
    fVar13 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(info.valueMin.m_data + 2));
    fVar14 = tcu::Vector<float,_4>::y((Vector<float,_4> *)&blueScale);
    fVar15 = tcu::Vector<float,_4>::z((Vector<float,_4> *)&blueScale);
    fVar16 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(info.valueMin.m_data + 2));
    fVar17 = tcu::Vector<float,_4>::z((Vector<float,_4> *)&blueScale);
    color_3.m_data[3] = (fVar16 - fVar17) * fVar9 + fVar15;
    fVar9 = tcu::Vector<float,_4>::w((Vector<float,_4> *)&blueScale);
    fVar15 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(info.valueMin.m_data + 2));
    fVar16 = tcu::Vector<float,_4>::w((Vector<float,_4> *)&blueScale);
    color_3.m_data[2] = (fVar15 - fVar16) * fVar11 + fVar9;
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)local_170,(fVar19 - fVar20) * fVar8 + fVar18,
               (fVar13 - fVar14) * fVar10 + fVar12,color_3.m_data[3],color_3.m_data[2]);
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&green_4,(TextureLevel *)info.lookupBias.m_data._8_8_);
    tcu::clear((PixelBufferAccess *)&green_4,(Vec4 *)local_170);
    p_Var1 = gl->clearBufferfv;
    pfVar5 = tcu::Vector<float,_4>::getPtr((Vector<float,_4> *)local_170);
    (*p_Var1)(0x1800,renderbufferNdx,pfVar5);
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    fVar18 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(info.valueMin.m_data + 2));
    fVar19 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(info.valueMin.m_data + 2));
    fVar20 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(info.valueMin.m_data + 2));
    color_4.m_data[3] = fVar20 * fVar9;
    fVar9 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(info.valueMin.m_data + 2));
    color_4.m_data[2] = fVar9 * fVar11;
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)local_1b8,fVar18 * fVar8,fVar19 * fVar10,color_4.m_data[3],
               color_4.m_data[2]);
    tcu::PixelBufferAccess::PixelBufferAccess
              (&local_1e0,(TextureLevel *)info.lookupBias.m_data._8_8_);
    tcu::clear(&local_1e0,(Vec4 *)local_1b8);
    p_Var1 = gl->clearBufferfv;
    pfVar5 = tcu::Vector<float,_4>::getPtr((Vector<float,_4> *)local_1b8);
    (*p_Var1)(0x1800,renderbufferNdx,pfVar5);
    break;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    fVar18 = tcu::Vector<float,_4>::x((Vector<float,_4> *)&blueScale);
    fVar19 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(info.valueMin.m_data + 2));
    fVar20 = tcu::Vector<float,_4>::x((Vector<float,_4> *)&blueScale);
    fVar12 = tcu::Vector<float,_4>::y((Vector<float,_4> *)&blueScale);
    fVar13 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(info.valueMin.m_data + 2));
    fVar14 = tcu::Vector<float,_4>::y((Vector<float,_4> *)&blueScale);
    fVar15 = tcu::Vector<float,_4>::z((Vector<float,_4> *)&blueScale);
    fVar16 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(info.valueMin.m_data + 2));
    fVar17 = tcu::Vector<float,_4>::z((Vector<float,_4> *)&blueScale);
    color_1.m_data[3] = (int)((fVar16 - fVar17) * fVar9 + fVar15);
    fVar9 = tcu::Vector<float,_4>::w((Vector<float,_4> *)&blueScale);
    fVar15 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(info.valueMin.m_data + 2));
    fVar16 = tcu::Vector<float,_4>::w((Vector<float,_4> *)&blueScale);
    color_1.m_data[2] = (int)((fVar15 - fVar16) * fVar11 + fVar9);
    tcu::Vector<int,_4>::Vector
              ((Vector<int,_4> *)local_e0,(int)((fVar19 - fVar20) * fVar8 + fVar18),
               (int)((fVar13 - fVar14) * fVar10 + fVar12),color_1.m_data[3],color_1.m_data[2]);
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&green_2,(TextureLevel *)info.lookupBias.m_data._8_8_);
    tcu::clear((PixelBufferAccess *)&green_2,(IVec4 *)local_e0);
    p_Var2 = gl->clearBufferiv;
    piVar6 = tcu::Vector<int,_4>::getPtr((Vector<int,_4> *)local_e0);
    (*p_Var2)(0x1800,renderbufferNdx,piVar6);
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    pfVar5 = info.valueMin.m_data + 2;
    fVar18 = tcu::Vector<float,_4>::x((Vector<float,_4> *)pfVar5);
    fVar19 = tcu::Vector<float,_4>::y((Vector<float,_4> *)pfVar5);
    fVar20 = tcu::Vector<float,_4>::z((Vector<float,_4> *)pfVar5);
    color_2.m_data[3] = (uint)(long)(fVar20 * fVar9);
    fVar9 = tcu::Vector<float,_4>::w((Vector<float,_4> *)pfVar5);
    color_2.m_data[2] = (uint)(long)(fVar9 * fVar11);
    tcu::Vector<unsigned_int,_4>::Vector
              ((Vector<unsigned_int,_4> *)local_128,(uint)(long)(fVar18 * fVar8),
               (uint)(long)(fVar19 * fVar10),color_2.m_data[3],color_2.m_data[2]);
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&green_3,(TextureLevel *)info.lookupBias.m_data._8_8_);
    tcu::clear((PixelBufferAccess *)&green_3,(UVec4 *)local_128);
    p_Var3 = gl->clearBufferuiv;
    puVar7 = tcu::Vector<unsigned_int,_4>::getPtr((Vector<unsigned_int,_4> *)local_128);
    (*p_Var3)(0x1800,renderbufferNdx,puVar7);
    break;
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    color.m_data[3] = fVar9 * 2000.0 + -1000.0;
    color.m_data[2] = fVar11 * 2000.0 + -1000.0;
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)local_98,fVar8 * 2000.0 + -1000.0,fVar10 * 2000.0 + -1000.0,
               color.m_data[3],color.m_data[2]);
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&green_1,(TextureLevel *)info.lookupBias.m_data._8_8_);
    tcu::clear((PixelBufferAccess *)&green_1,(Vec4 *)local_98);
    p_Var1 = gl->clearBufferfv;
    pfVar5 = tcu::Vector<float,_4>::getPtr((Vector<float,_4> *)local_98);
    (*p_Var1)(0x1800,renderbufferNdx,pfVar5);
  }
  err = (*gl->getError)();
  glu::checkError(err,"Failed to clear renderbuffer.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawBuffersIndexedTests.cpp"
                  ,0x183);
  return;
}

Assistant:

void clearRenderbuffer (const glw::Functions&			gl,
						const tcu::TextureFormat&		format,
						int								renderbufferNdx,
						int								renderbufferCount,
						tcu::TextureLevel&				refRenderbuffer)
{
	const tcu::TextureFormatInfo	info		= tcu::getTextureFormatInfo(format);

	// Clear each buffer to different color
	const float						redScale	= float(renderbufferNdx + 1) / float(renderbufferCount);
	const float						blueScale	= float(renderbufferCount - renderbufferNdx) / float(renderbufferCount);
	const float						greenScale	= float(((renderbufferCount/2) + renderbufferNdx) % renderbufferCount) / float(renderbufferCount);
	// Alpha should never be zero as advanced blend equations assume premultiplied alpha.
	const float						alphaScale	= float(1 + (((renderbufferCount/2) + renderbufferCount - renderbufferNdx) % renderbufferCount)) / float(renderbufferCount);

	switch (tcu::getTextureChannelClass(format.type))
	{
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
		{
			const float red		= -1000.0f + 2000.0f * redScale;
			const float green	= -1000.0f + 2000.0f * greenScale;
			const float blue	= -1000.0f + 2000.0f * blueScale;
			const float alpha	= -1000.0f + 2000.0f * alphaScale;
			const Vec4	color	(red, green, blue, alpha);

			tcu::clear(refRenderbuffer, color);
			gl.clearBufferfv(GL_COLOR, renderbufferNdx, color.getPtr());
			break;
		}

		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
		{
			const deInt32	red		= deInt32(info.valueMin.x() + (info.valueMax.x() - info.valueMin.x()) * redScale);
			const deInt32	green	= deInt32(info.valueMin.y() + (info.valueMax.y() - info.valueMin.y()) * greenScale);
			const deInt32	blue	= deInt32(info.valueMin.z() + (info.valueMax.z() - info.valueMin.z()) * blueScale);
			const deInt32	alpha	= deInt32(info.valueMin.w() + (info.valueMax.w() - info.valueMin.w()) * alphaScale);
			const IVec4		color	(red, green, blue, alpha);

			tcu::clear(refRenderbuffer, color);
			gl.clearBufferiv(GL_COLOR, renderbufferNdx, color.getPtr());
			break;
		}

		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
		{
			const deUint32	red		= deUint32(info.valueMax.x() * redScale);
			const deUint32	green	= deUint32(info.valueMax.y() * greenScale);
			const deUint32	blue	= deUint32(info.valueMax.z() * blueScale);
			const deUint32	alpha	= deUint32(info.valueMax.w() * alphaScale);
			const UVec4		color	(red, green, blue, alpha);

			tcu::clear(refRenderbuffer, color);
			gl.clearBufferuiv(GL_COLOR, renderbufferNdx, color.getPtr());
			break;
		}

		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
		{
			const float red		= info.valueMin.x() + (info.valueMax.x() - info.valueMin.x()) * redScale;
			const float green	= info.valueMin.y() + (info.valueMax.y() - info.valueMin.y()) * greenScale;
			const float blue	= info.valueMin.z() + (info.valueMax.z() - info.valueMin.z()) * blueScale;
			const float alpha	= info.valueMin.w() + (info.valueMax.w() - info.valueMin.w()) * alphaScale;
			const Vec4	color	(red, green, blue, alpha);

			tcu::clear(refRenderbuffer, color);
			gl.clearBufferfv(GL_COLOR, renderbufferNdx, color.getPtr());
			break;
		}

		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
		{
			const float red		= info.valueMax.x() * redScale;
			const float green	= info.valueMax.y() * greenScale;
			const float blue	= info.valueMax.z() * blueScale;
			const float alpha	= info.valueMax.w() * alphaScale;
			const Vec4	color	(red, green, blue, alpha);

			tcu::clear(refRenderbuffer, color);
			gl.clearBufferfv(GL_COLOR, renderbufferNdx, color.getPtr());
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to clear renderbuffer.");
}